

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

bool __thiscall
spvc_resources_s::copy_resources
          (spvc_resources_s *this,SmallVector<spvc_reflected_builtin_resource,_8UL> *outputs,
          SmallVector<spirv_cross::BuiltInResource,_8UL> *inputs)

{
  BuiltInResource *pBVar1;
  spvc_reflected_resource *r;
  spvc_reflected_builtin_resource br;
  BuiltInResource *i;
  BuiltInResource *__end1;
  BuiltInResource *__begin1;
  SmallVector<spirv_cross::BuiltInResource,_8UL> *__range1;
  SmallVector<spirv_cross::BuiltInResource,_8UL> *inputs_local;
  SmallVector<spvc_reflected_builtin_resource,_8UL> *outputs_local;
  spvc_resources_s *this_local;
  
  __end1 = spirv_cross::VectorView<spirv_cross::BuiltInResource>::begin
                     (&inputs->super_VectorView<spirv_cross::BuiltInResource>);
  pBVar1 = spirv_cross::VectorView<spirv_cross::BuiltInResource>::end
                     (&inputs->super_VectorView<spirv_cross::BuiltInResource>);
  while( true ) {
    if (__end1 == pBVar1) {
      return true;
    }
    br.resource.name = (char *)__end1;
    r._4_4_ = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->value_type_id)
    ;
    r._0_4_ = *(undefined4 *)br.resource.name;
    br.value_type_id =
         spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)(br.resource.name + 0x10));
    br.resource.id =
         spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)(br.resource.name + 0xc));
    br.builtin = spirv_cross::TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)(br.resource.name + 8));
    br.resource._8_8_ =
         spvc_context_s::allocate_name(this->context,(string *)(br.resource.name + 0x18));
    if ((char *)br.resource._8_8_ == (char *)0x0) break;
    spirv_cross::SmallVector<spvc_reflected_builtin_resource,_8UL>::push_back
              (outputs,(spvc_reflected_builtin_resource *)&r);
    __end1 = __end1 + 1;
  }
  return false;
}

Assistant:

bool spvc_resources_s::copy_resources(SmallVector<spvc_reflected_builtin_resource> &outputs,
                                      const SmallVector<BuiltInResource> &inputs)
{
	for (auto &i : inputs)
	{
		spvc_reflected_builtin_resource br;

		br.value_type_id = i.value_type_id;
		br.builtin = SpvBuiltIn(i.builtin);

		auto &r = br.resource;
		r.base_type_id = i.resource.base_type_id;
		r.type_id = i.resource.type_id;
		r.id = i.resource.id;
		r.name = context->allocate_name(i.resource.name);
		if (!r.name)
			return false;

		outputs.push_back(br);
	}

	return true;
}